

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O2

void __thiscall
RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
::reset_and_resize(RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
                   *this,size_t n)

{
  DataBlock **ppDVar1;
  
  reset(this);
  ppDVar1 = __gnu_cxx::new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocate
                      ((new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)this,n,
                       (void *)0x0);
  this->arr_ = ppDVar1;
  this->begin_ = ppDVar1;
  this->end_ = ppDVar1;
  this->size_ = 0;
  this->allocSize_ = n;
  return;
}

Assistant:

void reset_and_resize(std::size_t n) {
        reset();
        end_ = begin_ = arr_ = allocator_.allocate(n);
        size_ = 0;
        allocSize_ = n;
    }